

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this,
          TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *gel)

{
  int64_t iVar1;
  long lVar2;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018836e0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_01883338,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_01883038;
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_0188de50;
  iVar1 = (gel->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[1];
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[0] =
       (gel->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[2] =
       (gel->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes[2];
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.super_TPZTriangle.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoTriangle_0188ddc8;
  lVar2 = 0x70;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar2 + -0x58)
         = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     (&(((TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *)(&this->fGeo + -2))->super_TPZGeoEl).field_0x0 +
     lVar2) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar2 + -0x50)
         = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x118);
  lVar2 = 0x60;
  do {
    TPZGeoElSide::TPZGeoElSide
              (&local_48,
               (TPZGeoElSideIndex *)
               (&(((TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *)(&this->fGeo + -2))->super_TPZGeoEl).
                 field_0x0 + lVar2),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&local_60,
               (TPZGeoElSideIndex *)
               (&(((TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *)(&gel->fGeo + -2))->super_TPZGeoEl).
                 field_0x0 + lVar2),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&local_48,&local_60);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x108);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}